

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# URResolution.cpp
# Opt level: O2

void __thiscall
Inferences::URResolution::Item::Item
          (Item *this,Clause *cl,bool selectedOnly,URResolution *parent,bool mustResolveAll)

{
  undefined8 uVar1;
  bool bVar2;
  Color CVar3;
  Literal *pLVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  
  this->_orig = cl;
  CVar3 = Kernel::Clause::color(cl);
  this->_color = CVar3;
  (this->_premises)._size = 0;
  (this->_premises)._capacity = 0;
  (this->_lits)._end = (Literal **)0x0;
  (this->_premises)._array = (Clause **)0x0;
  (this->_lits)._capacity = 0;
  (this->_lits)._stack = (Literal **)0x0;
  (this->_lits)._cursor = (Literal **)0x0;
  this->_parent = parent;
  uVar1 = *(undefined8 *)&cl->field_0x38;
  if (*(int *)(Lib::env + 0x8898) == 2) {
    pLVar4 = Kernel::Clause::getAnswerLiteral(cl);
  }
  else {
    pLVar4 = (Literal *)0x0;
  }
  uVar8 = (uint)uVar1;
  uVar7 = uVar8 & 0xfffff;
  this->_ansLit = pLVar4;
  this->_mustResolveAll = uVar7 < (pLVar4 == (Literal *)0x0 ^ 3) || (mustResolveAll || selectedOnly)
  ;
  uVar7 = uVar7 - (pLVar4 != (Literal *)0x0);
  Lib::DArray<Kernel::Clause_*>::init(&this->_premises,(EVP_PKEY_CTX *)(ulong)uVar7);
  Lib::Stack<Kernel::Literal_*>::reserve(&this->_lits,(size_t)(ulong)uVar7);
  uVar6 = 0;
  for (uVar5 = 0; (uVar8 & 0xfffff) != uVar5; uVar5 = uVar5 + 1) {
    if (cl->_literals[uVar5] != this->_ansLit) {
      Lib::Stack<Kernel::Literal_*>::push(&this->_lits,cl->_literals[uVar5]);
      bVar2 = Kernel::Term::ground(&(this->_lits)._cursor[-1]->super_Term);
      uVar6 = uVar6 + !bVar2;
    }
  }
  this->_atMostOneNonGround = uVar6 < 2;
  if (selectedOnly) {
    uVar7 = *(uint *)&cl->field_0x3c & 0xfffff;
  }
  this->_activeLength = uVar7;
  return;
}

Assistant:

Item(Clause* cl, bool selectedOnly, URResolution& parent, bool mustResolveAll)
  : _orig(cl), _color(cl->color()), _parent(parent)
  {
    unsigned clen = cl->length();
    bool synthesis = (env.options->questionAnswering() == Options::QuestionAnsweringMode::SYNTHESIS);
    _ansLit = synthesis ? cl->getAnswerLiteral() : nullptr;
    _mustResolveAll = mustResolveAll || (selectedOnly ? true : (clen < 2 + (_ansLit ? 1 : 0)));
    unsigned litslen = clen - (_ansLit ? 1 : 0);
    _premises.init(litslen, 0);
    _lits.reserve(litslen);
    unsigned nonGroundCnt = 0;
    for(unsigned i=0; i<clen; i++) {
      if ((*cl)[i] != _ansLit) {
        _lits.push((*cl)[i]);
        if(!_lits.top()->ground()) nonGroundCnt++;
      }
    }
    _atMostOneNonGround = nonGroundCnt<=1;

    _activeLength = selectedOnly ? cl->numSelected() : litslen;
    ASS_REP2(_activeLength>=litslen-1, cl->toString(), cl->numSelected());
  }